

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O3

void __thiscall CompileCommandParser::ParseString(CompileCommandParser *this)

{
  ulong uVar1;
  
  std::__cxx11::string::_M_replace
            ((ulong)&this->String,0,(char *)(this->String)._M_string_length,0x1c0ee8);
  if (this->C != '\"') {
    return;
  }
  do {
    Next(this);
    uVar1 = (ulong)(byte)this->C;
    if (0x20 < uVar1) break;
  } while ((0x100002600U >> (uVar1 & 0x3f) & 1) != 0);
  do {
    if ((char)uVar1 == '\\') {
      do {
        Next(this);
        if (0x20 < (ulong)(byte)this->C) break;
      } while ((0x100002600U >> ((ulong)(byte)this->C & 0x3f) & 1) != 0);
    }
    else if ((int)uVar1 == 0x22) {
      do {
        Next(this);
        if (0x20 < (ulong)(byte)this->C) {
          return;
        }
      } while ((0x100002600U >> ((ulong)(byte)this->C & 0x3f) & 1) != 0);
      return;
    }
    std::__cxx11::string::_M_replace_aux
              ((ulong)&this->String,(this->String)._M_string_length,0,'\x01');
    Next(this);
    uVar1 = (ulong)(byte)this->C;
  } while( true );
}

Assistant:

void ParseString()
  {
    this->String = "";
    if(!Expect('"')) return;
    while (!Expect('"'))
      {
      Expect('\\');
      this->String.append(1,C);
      Next();
      }
  }